

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::iterate
          (FeedbackRecordVariableSelectionCase *this)

{
  ostringstream *poVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  float *pfVar6;
  TestError *pTVar7;
  long lVar8;
  Vec4 *a;
  long lVar9;
  Vector<float,_4> local_234;
  tcu local_224 [4];
  VertexArray vao;
  Vec4 feedbackValues [3];
  Vector<float,_4> local_1d0;
  Vector<float,_4> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  iVar4 = (**(code **)(lVar9 + 0x780))((this->m_program->m_program).m_program,"a_position");
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  if (iVar4 == -1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"a_position attribute location was -1",
               (allocator<char> *)feedbackValues);
    tcu::TestError::TestError(pTVar7,(string *)local_1b0);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Rendering a patch of size 3.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar9 + 0x1a00))(0,0,1);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb5f);
  (**(code **)(lVar9 + 0xd8))(vao.super_ObjectWrapper.m_object);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"bindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb62);
  (**(code **)(lVar9 + 0x1858))(0,0,0,0x3f800000,iVar4);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"vertexAttrib4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb65);
  (**(code **)(lVar9 + 0x1680))((this->m_program->m_program).m_program);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb68);
  (**(code **)(lVar9 + 0xfd8))(0x8e72,3);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6b);
  (**(code **)(lVar9 + 0x48))(0x8c8e,0,this->m_xfbBuf);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"bind xfb buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6e);
  (**(code **)(lVar9 + 0x30))(4);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb71);
  (**(code **)(lVar9 + 0x538))(0xe,0,3);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb74);
  (**(code **)(lVar9 + 0x638))();
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb77);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  lVar8 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)feedbackValues[0].m_data + lVar8));
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x30);
  pfVar6 = (float *)(**(code **)(lVar9 + 0xd00))(0x8c8e,0,0x30,1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb7f);
  if (pfVar6 != (float *)0x0) {
    feedbackValues[0].m_data[0] = *pfVar6;
    feedbackValues[0].m_data[1] = pfVar6[1];
    feedbackValues[0].m_data[2] = pfVar6[2];
    feedbackValues[0].m_data[3] = pfVar6[3];
    feedbackValues[1].m_data[0] = pfVar6[4];
    feedbackValues[1].m_data[1] = pfVar6[5];
    feedbackValues[1].m_data[2] = pfVar6[6];
    feedbackValues[1].m_data[3] = pfVar6[7];
    feedbackValues[2].m_data[0] = pfVar6[8];
    feedbackValues[2].m_data[1] = pfVar6[9];
    feedbackValues[2].m_data[2] = pfVar6[10];
    feedbackValues[2].m_data[3] = pfVar6[0xb];
    cVar2 = (**(code **)(lVar9 + 0x1670))(0x8c8e);
    if (cVar2 == '\x01') {
      a = feedbackValues;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        tcu::Vector<float,_4>::Vector(&local_1c0,3.0);
        tcu::operator-((tcu *)&local_234,a,&local_1c0);
        tcu::abs<float,4>((tcu *)local_1b0,&local_234);
        tcu::Vector<float,_4>::Vector(&local_1d0,0.001);
        tcu::lessThan<float,4>(local_224,(Vector<float,_4> *)local_1b0,&local_1d0);
        bVar3 = tcu::boolAll<4>((Vector<bool,_4> *)local_224);
        if (!bVar3) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Feedback vertex ");
          std::ostream::operator<<(poVar1,(int)lVar9);
          std::operator<<((ostream *)poVar1,": expected (3.0, 3.0, 3.0, 3.0), got ");
          tcu::operator<<((ostream *)poVar1,a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"got unexpected feedback results");
        }
        a = a + 1;
      }
      glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
      return STOP;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"unmapBuffer did not return TRUE",(allocator<char> *)&local_234);
    tcu::TestError::TestError(pTVar7,(string *)local_1b0);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"mapBufferRange returned null",(allocator<char> *)&local_234);
  tcu::TestError::TestError(pTVar7,(string *)local_1b0);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FeedbackRecordVariableSelectionCase::IterateResult FeedbackRecordVariableSelectionCase::iterate (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	const int				posLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glu::VertexArray	vao		(m_context.getRenderContext());

	if (posLoc == -1)
		throw tcu::TestError("a_position attribute location was -1");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering a patch of size 3." << tcu::TestLog::EndMessage;

	// Render and feed back

	gl.viewport(0, 0, 1, 1);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindVertexArray(*vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindVertexArray");

	gl.vertexAttrib4f(posLoc, 0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "vertexAttrib4f");

	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind xfb buf");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	gl.drawArrays(GL_PATCHES, 0, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)." << tcu::TestLog::EndMessage;

	// Read back result (one triangle)
	{
		tcu::Vec4	feedbackValues[3];
		const void* mapPtr				= gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, (int)sizeof(feedbackValues), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapBufferRange");

		if (mapPtr == DE_NULL)
			throw tcu::TestError("mapBufferRange returned null");

		deMemcpy(feedbackValues, mapPtr, sizeof(feedbackValues));

		if (gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER) != GL_TRUE)
			throw tcu::TestError("unmapBuffer did not return TRUE");

		for (int ndx = 0; ndx < 3; ++ndx)
		{
			if (!tcu::boolAll(tcu::lessThan(tcu::abs(feedbackValues[ndx] - tcu::Vec4(3.0f)), tcu::Vec4(0.001f))))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Feedback vertex " << ndx << ": expected (3.0, 3.0, 3.0, 3.0), got " << feedbackValues[ndx] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected feedback results");
			}
		}
	}

	return STOP;
}